

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent_dss.c
# Opt level: O1

void * duckdb_je_extent_alloc_dss
                 (tsdn_t *tsdn,arena_t *arena,void *new_addr,size_t size,size_t alignment,
                 _Bool *zero,_Bool *commit)

{
  void *pvVar1;
  _Bool _Var2;
  _Bool _Var3;
  edata_t *edata_00;
  pac_t *pac;
  void *pvVar4;
  size_t sVar5;
  void *pvVar6;
  ehooks_t *peVar7;
  ulong uVar8;
  spin_t spinner;
  uint uVar9;
  edata_cache_t *edata_cache;
  int iVar10;
  void *pvVar11;
  void *pvVar12;
  bool bVar13;
  edata_t edata;
  void *local_f8;
  edata_t local_b8;
  
  if (-1 < (long)size) {
    edata_cache = &(arena->pa_shard).edata_cache;
    edata_00 = duckdb_je_edata_cache_get(tsdn,edata_cache);
    if (edata_00 != (edata_t *)0x0) {
      uVar9 = 0;
      do {
        LOCK();
        bVar13 = dss_extending.repr == false;
        if (bVar13) {
          dss_extending.repr = true;
        }
        UNLOCK();
        if (!bVar13) {
          if (uVar9 < 5) {
            local_b8.e_bits = local_b8.e_bits & 0xffffffff00000000;
            while ((uint)local_b8.e_bits >> ((byte)uVar9 & 0x1f) == 0) {
              local_b8.e_bits = CONCAT44(local_b8.e_bits._4_4_,(uint)local_b8.e_bits + 1);
            }
            uVar9 = uVar9 + 1;
          }
          else {
            sched_yield();
          }
        }
      } while (!bVar13);
      if ((dss_exhausted.repr & 1U) == 0) {
        pac = &(arena->pa_shard).pac;
        do {
          pvVar4 = sbrk(0);
          _Var3 = duckdb_je_opt_retain;
          pvVar12 = (void *)0x0;
          if (pvVar4 != (void *)0xffffffffffffffff) {
            pvVar12 = (void *)0x0;
            if (pvVar4 == new_addr) {
              pvVar12 = pvVar4;
            }
            dss_max.repr = pvVar4;
            if (new_addr == (void *)0x0) {
              pvVar12 = pvVar4;
            }
          }
          iVar10 = 10;
          if (pvVar12 != (void *)0x0) {
            pvVar11 = (void *)((long)pvVar12 + 0xfffU & 0xfffffffffffff000);
            pvVar4 = (void *)((alignment - 1) + (long)pvVar11 & -alignment);
            if ((long)pvVar4 - (long)pvVar11 != 0) {
              uVar9 = arena->ind;
              sVar5 = duckdb_je_extent_sn_next(pac);
              edata_00->e_addr = pvVar11;
              (edata_00->field_2).e_size_esn =
                   (ulong)((uint)(edata_00->field_2).e_size_esn & 0xfff) |
                   (long)pvVar4 - (long)pvVar11;
              edata_00->e_sn = sVar5;
              uVar8 = 0x100000002000;
              if (_Var3 == false) {
                uVar8 = 0x2000;
              }
              edata_00->e_bits =
                   uVar8 | (edata_00->e_bits & 0xfffffffff00fe000 |
                           (ulong)uVar9 & 0xfffffffff00fefff) & 0xffffeffffe800fff | 0xe800000;
            }
            pvVar1 = (void *)(size + (long)pvVar4);
            if (pvVar1 < pvVar12 || pvVar4 < pvVar12) {
              iVar10 = 10;
            }
            else {
              pvVar6 = sbrk((size - (long)pvVar12) + (long)pvVar4);
              if (pvVar6 == pvVar12) {
                dss_extending.repr = false;
                dss_max.repr = pvVar1;
                if (pvVar11 == pvVar4) {
                  duckdb_je_edata_cache_put(tsdn,edata_cache,edata_00);
                }
                else {
                  peVar7 = duckdb_je_arena_get_ehooks(arena);
                  duckdb_je_extent_dalloc_gap(tsdn,pac,peVar7,edata_00);
                }
                if (*commit == false) {
                  _Var2 = duckdb_je_pages_decommit(pvVar4,size);
                  *commit = _Var2;
                }
                iVar10 = 1;
                local_f8 = pvVar4;
                if ((*zero == true) && (*commit == true)) {
                  local_b8.field_6.e_slab_data.bitmap[6] = 0;
                  local_b8.field_6.e_slab_data.bitmap[7] = 0;
                  local_b8.field_6.e_slab_data.bitmap[4] = 0;
                  local_b8.field_6.e_slab_data.bitmap[5] = 0;
                  local_b8.field_6.e_slab_data.bitmap[2] = 0;
                  local_b8.field_6.e_slab_data.bitmap[3] = 0;
                  local_b8.field_6.ql_link_inactive.qre_next = (edata_t *)0x0;
                  local_b8.field_6.ql_link_inactive.qre_prev = (edata_t *)0x0;
                  local_b8.field_5.ql_link_active.qre_prev = (edata_t *)0x0;
                  local_b8.field_5._16_8_ = 0;
                  local_b8.e_sn = 0;
                  local_b8.field_5.ql_link_active.qre_next = (edata_t *)0x0;
                  local_b8.field_2.e_size_esn = 0;
                  local_b8.e_ps = (hpdata_t *)0x0;
                  local_b8.e_bits = 0;
                  local_b8.e_addr = (void *)0x0;
                  peVar7 = duckdb_je_arena_get_ehooks(arena);
                  local_b8.field_2.e_size_esn = (uint)local_b8.field_2.e_size_esn & 0xfff | size;
                  local_b8.e_sn = 0xe8;
                  uVar8 = 0x100000002000;
                  if (_Var3 == false) {
                    uVar8 = 0x2000;
                  }
                  local_b8.e_bits =
                       uVar8 | (local_b8.e_bits & 0xfffffffff00fe000 |
                               (ulong)arena->ind & 0xfffffffff00fefff) & 0xffffeffff0001fff |
                               (ulong)(size != 0) << 0xc;
                  local_b8.e_addr = pvVar4;
                  _Var3 = duckdb_je_extent_purge_forced_wrapper(tsdn,peVar7,&local_b8,0,size);
                  if (_Var3) {
                    switchD_01306cb1::default(pvVar4,0,size);
                  }
                }
              }
              else {
                iVar10 = 10;
                if (pvVar6 == (void *)0xffffffffffffffff) {
                  dss_exhausted.repr = true;
                }
                else {
                  iVar10 = 0;
                }
              }
            }
          }
        } while (iVar10 == 0);
        if (iVar10 != 10) {
          return local_f8;
        }
      }
      dss_extending.repr = false;
      duckdb_je_edata_cache_put(tsdn,edata_cache,edata_00);
    }
  }
  return (void *)0x0;
}

Assistant:

void *
extent_alloc_dss(tsdn_t *tsdn, arena_t *arena, void *new_addr, size_t size,
    size_t alignment, bool *zero, bool *commit) {
	edata_t *gap;

	cassert(have_dss);
	assert(size > 0);
	assert(alignment == ALIGNMENT_CEILING(alignment, PAGE));

	/*
	 * sbrk() uses a signed increment argument, so take care not to
	 * interpret a large allocation request as a negative increment.
	 */
	if ((intptr_t)size < 0) {
		return NULL;
	}

	gap = edata_cache_get(tsdn, &arena->pa_shard.edata_cache);
	if (gap == NULL) {
		return NULL;
	}

	extent_dss_extending_start();
	if (!atomic_load_b(&dss_exhausted, ATOMIC_ACQUIRE)) {
		/*
		 * The loop is necessary to recover from races with other
		 * threads that are using the DSS for something other than
		 * malloc.
		 */
		while (true) {
			void *max_cur = extent_dss_max_update(new_addr);
			if (max_cur == NULL) {
				goto label_oom;
			}

			bool head_state = opt_retain ? EXTENT_IS_HEAD :
			    EXTENT_NOT_HEAD;
			/*
			 * Compute how much page-aligned gap space (if any) is
			 * necessary to satisfy alignment.  This space can be
			 * recycled for later use.
			 */
			void *gap_addr_page = ALIGNMENT_ADDR2CEILING(max_cur,
			    PAGE);
			void *ret = ALIGNMENT_ADDR2CEILING(
			    gap_addr_page, alignment);
			size_t gap_size_page = (uintptr_t)ret -
			    (uintptr_t)gap_addr_page;
			if (gap_size_page != 0) {
				edata_init(gap, arena_ind_get(arena),
				    gap_addr_page, gap_size_page, false,
				    SC_NSIZES, extent_sn_next(
					&arena->pa_shard.pac),
				    extent_state_active, false, true,
				    EXTENT_PAI_PAC, head_state);
			}
			/*
			 * Compute the address just past the end of the desired
			 * allocation space.
			 */
			void *dss_next = (void *)((byte_t *)ret + size);
			if ((uintptr_t)ret < (uintptr_t)max_cur ||
			    (uintptr_t)dss_next < (uintptr_t)max_cur) {
				goto label_oom; /* Wrap-around. */
			}
			/* Compute the increment, including subpage bytes. */
			void *gap_addr_subpage = max_cur;
			size_t gap_size_subpage = (uintptr_t)ret -
			    (uintptr_t)gap_addr_subpage;
			intptr_t incr = gap_size_subpage + size;

			assert((uintptr_t)max_cur + incr == (uintptr_t)ret +
			    size);

			/* Try to allocate. */
			void *dss_prev = extent_dss_sbrk(incr);
			if (dss_prev == max_cur) {
				/* Success. */
				atomic_store_p(&dss_max, dss_next,
				    ATOMIC_RELEASE);
				extent_dss_extending_finish();

				if (gap_size_page != 0) {
					ehooks_t *ehooks = arena_get_ehooks(
					    arena);
					extent_dalloc_gap(tsdn,
					    &arena->pa_shard.pac, ehooks, gap);
				} else {
					edata_cache_put(tsdn,
					    &arena->pa_shard.edata_cache, gap);
				}
				if (!*commit) {
					*commit = pages_decommit(ret, size);
				}
				if (*zero && *commit) {
					edata_t edata = {0};
					ehooks_t *ehooks = arena_get_ehooks(
					    arena);

					edata_init(&edata,
					    arena_ind_get(arena), ret, size,
					    size, false, SC_NSIZES,
					    extent_state_active, false, true,
					    EXTENT_PAI_PAC, head_state);
					if (extent_purge_forced_wrapper(tsdn,
					    ehooks, &edata, 0, size)) {
						memset(ret, 0, size);
					}
				}
				return ret;
			}
			/*
			 * Failure, whether due to OOM or a race with a raw
			 * sbrk() call from outside the allocator.
			 */
			if (dss_prev == SBRK_INVALID) {
				/* OOM. */
				atomic_store_b(&dss_exhausted, true,
				    ATOMIC_RELEASE);
				goto label_oom;
			}
		}
	}
label_oom:
	extent_dss_extending_finish();
	edata_cache_put(tsdn, &arena->pa_shard.edata_cache, gap);
	return NULL;
}